

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QList<QString>>>(QDataStream *s,QList<QList<QString>_> *c)

{
  QDataStream QVar1;
  qint64 asize;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_68;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_48,s);
  QList<QList<QString>_>::clear(c);
  asize = QDataStream::readQSizeType(s);
  if (asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<QList<QString>_>::reserve(c,asize);
    lVar2 = asize + 1;
    do {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) break;
      local_68.d = (Data *)0x0;
      local_68.ptr = (QString *)0x0;
      local_68.size = 0;
      readArrayBasedContainer<QList<QString>>(s,(QList<QString> *)&local_68);
      QVar1 = s[0x13];
      if (QVar1 == (QDataStream)0x0) {
        QList<QList<QString>>::emplaceBack<QList<QString>const&>
                  ((QList<QList<QString>> *)c,(QList<QString> *)&local_68);
      }
      else {
        QList<QList<QString>_>::clear(c);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
    } while (QVar1 == (QDataStream)0x0);
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}